

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O0

size_t __thiscall
hbm::streaming::SubscribedSignal::processMeasuredData
          (SubscribedSignal *this,uchar *pData,size_t size,DataAsDoubleCb_t *cbDouble,
          DataAsRawCb_t *cbRaw)

{
  bool bVar1;
  ulong uVar2;
  function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
  *this_00;
  SubscribedSignal *__args;
  undefined8 in_RCX;
  ulong in_RDX;
  SubscribedSignal *in_RDI;
  deltaTimeInfo *in_R8;
  uint64_t ntpTimeStamp_1;
  size_t valueCount_1;
  size_t tupleSize;
  uint64_t ntpTimeStamp;
  size_t tupleSize_1;
  uint64_t timeStamp;
  size_t valueCount;
  size_t bytesProcessed;
  size_t in_stack_00000090;
  uchar *in_stack_00000098;
  SubscribedSignal *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffff90;
  pattern_t pVar3;
  undefined4 uVar4;
  SubscribedSignal *in_stack_ffffffffffffff98;
  function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
  *in_stack_ffffffffffffffa0;
  ulong local_38;
  size_t local_30;
  ulong local_18;
  
  local_30 = 0;
  pVar3 = in_RDI->m_dataFormatPattern;
  if (pVar3 == PATTERN_V) {
    local_38 = in_RDX / in_RDI->m_dataValueSize;
    if (local_38 < 0x81) {
      if (local_38 == 0) {
        return 0;
      }
    }
    else {
      local_38 = 0x80;
    }
    deltaTimeInfo::increment(in_R8,(uint)((ulong)in_RCX >> 0x20));
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
                        *)in_R8);
    if (bVar1) {
      interpretValuesAsDouble(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
      std::
      function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
      ::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   CONCAT44(pVar3,in_stack_ffffffffffffff90),(double *)in_RDI,(unsigned_long)in_R8);
    }
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
                        *)0x149a83);
    if (bVar1) {
      std::
      function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
      ::operator()((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
                    *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   CONCAT44(pVar3,in_stack_ffffffffffffff90),(uchar *)in_RDI,(unsigned_long)in_R8);
    }
    local_30 = local_38 * in_RDI->m_dataValueSize;
  }
  else if (pVar3 == PATTERN_TV) {
    uVar2 = in_RDI->m_dataTimeSize + in_RDI->m_dataValueSize;
    uVar4 = 1;
    for (local_18 = in_RDX; uVar2 <= local_18; local_18 = local_18 - uVar2) {
      interpreteNtpTimestamp(in_RDI,(uchar *)in_R8);
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
                          *)in_R8);
      if (bVar1) {
        interpretValuesAsDouble(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
        std::
        function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
        ::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     CONCAT44(uVar4,in_stack_ffffffffffffff90),(double *)in_RDI,(unsigned_long)in_R8
                    );
      }
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
                          *)0x149b5c);
      if (bVar1) {
        std::
        function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
        ::operator()((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
                      *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     CONCAT44(uVar4,in_stack_ffffffffffffff90),(uchar *)in_RDI,(unsigned_long)in_R8)
        ;
      }
      local_30 = uVar2 + local_30;
    }
  }
  else if ((pVar3 == PATTERN_TB) && (in_RDI->m_dataTimeSize + in_RDI->m_dataValueSize <= in_RDX)) {
    this_00 = (function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
               *)((in_RDX - in_RDI->m_dataTimeSize) / in_RDI->m_dataValueSize);
    if ((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
         *)0x80 < this_00) {
      this_00 = (function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
                 *)0x80;
    }
    __args = (SubscribedSignal *)interpreteNtpTimestamp(in_RDI,(uchar *)in_R8);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
                        *)in_R8);
    if (bVar1) {
      interpretValuesAsDouble(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
      std::
      function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
      ::operator()(this_00,__args,CONCAT44(pVar3,in_stack_ffffffffffffff90),(double *)in_RDI,
                   (unsigned_long)in_R8);
    }
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
                        *)0x149c73);
    if (bVar1) {
      std::
      function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
      ::operator()((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_unsigned_char_*,_unsigned_long)>
                    *)this_00,__args,CONCAT44(pVar3,in_stack_ffffffffffffff90),(uchar *)in_RDI,
                   (unsigned_long)in_R8);
    }
    local_30 = in_RDI->m_dataTimeSize + in_RDI->m_dataValueSize * (long)this_00;
  }
  return local_30;
}

Assistant:

size_t SubscribedSignal::processMeasuredData(unsigned char* pData, size_t size, DataAsDoubleCb_t cbDouble, DataAsRawCb_t cbRaw)
		{
			size_t bytesProcessed = 0;

			switch(m_dataFormatPattern) {
			case PATTERN_V:
				{
					size_t valueCount = size / m_dataValueSize;
					if (valueCount > m_valueBufferMaxValues) {
						valueCount = m_valueBufferMaxValues;
					} else if (valueCount == 0) {
						break;
					}
					uint64_t timeStamp = m_syncSignalTime.increment(valueCount);
					if (cbDouble) {
						interpretValuesAsDouble(pData, valueCount);
						cbDouble(*this, timeStamp, m_valueBuffer, valueCount);
					}

					if (cbRaw) {
						cbRaw(*this, timeStamp, pData, size);
					}
					bytesProcessed = valueCount * m_dataValueSize;
				}
				break;
			case PATTERN_TV:
				{
					// 1 time stamp, 1 value
					size_t tupleSize = m_dataTimeSize+m_dataValueSize;
					while (size>=tupleSize) {
						uint64_t ntpTimeStamp = interpreteNtpTimestamp(pData);
						pData += m_dataTimeSize;
						if (cbDouble) {
							interpretValuesAsDouble(pData, 1);
							cbDouble(*this, ntpTimeStamp, m_valueBuffer, 1);
						}

						if (cbRaw) {
							cbRaw(*this, ntpTimeStamp, pData, m_dataValueSize);
						}

						pData += m_dataValueSize;
						size -= tupleSize;
						bytesProcessed += tupleSize;
					}
				}
				break;
			case PATTERN_TB:
				// 1 time stamp n values
				size_t tupleSize = m_dataTimeSize+m_dataValueSize;
				if(size>=tupleSize) {
					size_t valueCount = (size-m_dataTimeSize) / m_dataValueSize;
					if(valueCount>m_valueBufferMaxValues) {
						valueCount=m_valueBufferMaxValues;
					}
					uint64_t ntpTimeStamp = interpreteNtpTimestamp(pData);
					if (cbDouble) {
						interpretValuesAsDouble(pData+m_dataTimeSize, valueCount);
						cbDouble(*this, ntpTimeStamp, m_valueBuffer, valueCount);
					}

					if (cbRaw) {
						cbRaw(*this, ntpTimeStamp+m_dataTimeSize, pData, size-m_dataTimeSize);
					}


					bytesProcessed = m_dataTimeSize + (m_dataValueSize*valueCount);
				}
				break;
			}
			return bytesProcessed;
		}